

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O1

bool __thiscall
google::protobuf::compiler::Parser::ParseMessageDefinition
          (Parser *this,DescriptorProto *message,LocationRecorder *message_location)

{
  bool bVar1;
  string *psVar2;
  LocationRecorder location;
  LocationRecorder LStack_38;
  
  bVar1 = Consume(this,"message");
  if (bVar1) {
    LocationRecorder::Init(&LStack_38,message_location);
    LocationRecorder::AddPath(&LStack_38,1);
    LocationRecorder::RecordLegacyLocation(&LStack_38,&message->super_Message,NAME);
    *(byte *)message->_has_bits_ = (byte)message->_has_bits_[0] | 1;
    if (message->name_ == (string *)internal::kEmptyString_abi_cxx11_) {
      psVar2 = (string *)operator_new(0x20);
      (psVar2->_M_dataplus)._M_p = (pointer)&psVar2->field_2;
      psVar2->_M_string_length = 0;
      (psVar2->field_2)._M_local_buf[0] = '\0';
      message->name_ = psVar2;
    }
    bVar1 = ConsumeIdentifier(this,message->name_,"Expected message name.");
    LocationRecorder::~LocationRecorder(&LStack_38);
    if (bVar1) {
      bVar1 = ParseMessageBlock(this,message,message_location);
      return bVar1;
    }
  }
  return false;
}

Assistant:

bool Parser::ParseMessageDefinition(DescriptorProto* message,
                                    const LocationRecorder& message_location) {
  DO(Consume("message"));
  {
    LocationRecorder location(message_location,
                              DescriptorProto::kNameFieldNumber);
    location.RecordLegacyLocation(
        message, DescriptorPool::ErrorCollector::NAME);
    DO(ConsumeIdentifier(message->mutable_name(), "Expected message name."));
  }
  DO(ParseMessageBlock(message, message_location));
  return true;
}